

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

unsigned_long_long
pugi::impl::anon_unknown_0::get_value_ullong(char_t *value,unsigned_long_long def)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulonglong uVar4;
  int __base;
  
  pbVar2 = (byte *)value;
  if (value == (char_t *)0x0) {
    return def;
  }
  do {
    pbVar3 = pbVar2;
    bVar1 = *pbVar3;
    pbVar2 = pbVar3 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
  __base = 10;
  if (pbVar3[bVar1 == 0x2d] == 0x30) {
    bVar1 = (pbVar3 + 1)[bVar1 == 0x2d];
    __base = 0x10;
    if (bVar1 != 0x78) {
      __base = 10;
      if (bVar1 == 0x58) {
        __base = 0x10;
      }
    }
  }
  uVar4 = strtoull(value,(char **)0x0,__base);
  return uVar4;
}

Assistant:

PUGI__FN unsigned long long get_value_ullong(const char_t* value, unsigned long long def)
	{
		if (!value) return def;

		int base = get_integer_base(value);

	#ifdef PUGIXML_WCHAR_MODE
		#ifdef PUGI__MSVC_CRT_VERSION
			return _wcstoui64(value, 0, base);
		#else
			return wcstoull(value, 0, base);
		#endif
	#else
		#ifdef PUGI__MSVC_CRT_VERSION
			return _strtoui64(value, 0, base);
		#else
			return strtoull(value, 0, base);
		#endif
	#endif
	}